

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  RayK<8> *pRVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [32];
  AccelData *pAVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [24];
  undefined1 auVar44 [24];
  undefined1 auVar45 [24];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  uint uVar48;
  ulong uVar49;
  undefined4 uVar50;
  ulong uVar51;
  Geometry *pGVar52;
  undefined4 uVar53;
  RayK<8> *pRVar54;
  RayK<8> *pRVar55;
  RayK<8> *pRVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  long lVar62;
  RayK<8> *pRVar63;
  long lVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  vint4 ai_1;
  undefined1 auVar72 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar73 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  vint4 ai;
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  uint uVar89;
  uint uVar90;
  uint uVar91;
  undefined4 uVar92;
  float fVar93;
  undefined4 uVar94;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined4 uVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar107 [64];
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1580 [32];
  undefined1 local_1560 [16];
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  undefined1 local_1530 [12];
  float fStack_1524;
  undefined1 local_1520 [8];
  float fStack_1518;
  float fStack_1514;
  undefined1 local_14e0 [32];
  undefined1 local_14a0 [32];
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  undefined1 local_1380 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  anon_union_32_3_898e2e57_for_vint_impl<8>_1 local_12c0;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined4 local_1180;
  undefined4 uStack_117c;
  undefined4 uStack_1178;
  undefined4 uStack_1174;
  undefined4 uStack_1170;
  undefined4 uStack_116c;
  undefined4 uStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  Geometry *local_fa0;
  ulong local_f98;
  RayK<8> local_f90 [3936];
  
  local_12c0 = valid_i->field_0;
  auVar22 = vpcmpeqd_avx2(in_ZMM14._0_32_,in_ZMM14._0_32_);
  local_1580 = vpcmpeqd_avx2(auVar22,(undefined1  [32])local_12c0);
  uVar48 = vmovmskps_avx(local_1580);
  if (uVar48 == 0) {
    return;
  }
  pAVar9 = This->ptr;
  uVar51 = (ulong)(uVar48 & 0xff);
  auVar46 = *(undefined1 (*) [32])ray;
  local_1240 = *(float *)(ray + 0x20);
  auVar47 = *(undefined1 (*) [32])(ray + 0x20);
  auVar8 = *(undefined1 (*) [32])(ray + 0x80);
  local_12e0._8_4_ = 0x7fffffff;
  local_12e0._0_8_ = 0x7fffffff7fffffff;
  local_12e0._12_4_ = 0x7fffffff;
  local_12e0._16_4_ = 0x7fffffff;
  local_12e0._20_4_ = 0x7fffffff;
  local_12e0._24_4_ = 0x7fffffff;
  local_12e0._28_4_ = 0x7fffffff;
  auVar10 = vandps_avx(auVar8,local_12e0);
  auVar96._8_4_ = 0x219392ef;
  auVar96._0_8_ = 0x219392ef219392ef;
  auVar96._12_4_ = 0x219392ef;
  auVar96._16_4_ = 0x219392ef;
  auVar96._20_4_ = 0x219392ef;
  auVar96._24_4_ = 0x219392ef;
  auVar96._28_4_ = 0x219392ef;
  auVar10 = vcmpps_avx(auVar10,auVar96,1);
  auVar74 = vblendvps_avx(auVar8,auVar96,auVar10);
  auVar10 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar65 = vandps_avx(auVar10,local_12e0);
  auVar65 = vcmpps_avx(auVar65,auVar96,1);
  auVar75 = vblendvps_avx(auVar10,auVar96,auVar65);
  auVar65 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar81 = vandps_avx(auVar65,local_12e0);
  auVar81 = vcmpps_avx(auVar81,auVar96,1);
  auVar81 = vblendvps_avx(auVar65,auVar96,auVar81);
  local_1260 = *(float *)(ray + 0x40);
  auVar96 = *(undefined1 (*) [32])(ray + 0x40);
  auVar87 = vrcpps_avx(auVar74);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar97._16_4_ = 0x3f800000;
  auVar97._20_4_ = 0x3f800000;
  auVar97._24_4_ = 0x3f800000;
  auVar97._28_4_ = 0x3f800000;
  auVar28 = vfnmadd213ps_fma(auVar74,auVar87,auVar97);
  auVar28 = vfmadd132ps_fma(ZEXT1632(auVar28),auVar87,auVar87);
  auVar74 = vrcpps_avx(auVar75);
  auVar29 = vfnmadd213ps_fma(auVar75,auVar74,auVar97);
  auVar75 = vrcpps_avx(auVar81);
  auVar29 = vfmadd132ps_fma(ZEXT1632(auVar29),auVar74,auVar74);
  auVar30 = vfnmadd213ps_fma(auVar81,auVar75,auVar97);
  auVar30 = vfmadd132ps_fma(ZEXT1632(auVar30),auVar75,auVar75);
  auVar74 = ZEXT1232(ZEXT812(0)) << 0x20;
  auVar81 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar74);
  local_1280 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar74);
  local_1580 = auVar22 ^ local_1580;
  auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
  auVar8 = vcmpps_avx(auVar8,auVar97,1);
  auVar74._8_4_ = 1;
  auVar74._0_8_ = 0x100000001;
  auVar74._12_4_ = 1;
  auVar74._16_4_ = 1;
  auVar74._20_4_ = 1;
  auVar74._24_4_ = 1;
  auVar74._28_4_ = 1;
  auVar8 = vandps_avx(auVar8,auVar74);
  auVar10 = vcmpps_avx(auVar10,auVar97,1);
  auVar87._8_4_ = 2;
  auVar87._0_8_ = 0x200000002;
  auVar87._12_4_ = 2;
  auVar87._16_4_ = 2;
  auVar87._20_4_ = 2;
  auVar87._24_4_ = 2;
  auVar87._28_4_ = 2;
  auVar10 = vandps_avx(auVar10,auVar87);
  auVar10 = vorps_avx(auVar10,auVar8);
  auVar75._8_4_ = 4;
  auVar75._0_8_ = 0x400000004;
  auVar75._12_4_ = 4;
  auVar75._16_4_ = 4;
  auVar75._20_4_ = 4;
  auVar75._24_4_ = 4;
  auVar75._28_4_ = 4;
  auVar8 = vcmpps_avx(auVar65,auVar97,1);
  auVar8 = vandps_avx(auVar8,auVar75);
  auVar8 = vpor_avx2(local_1580,auVar8);
  local_1300 = vpor_avx2(auVar8,auVar10);
  local_1220 = *(float *)ray;
  fStack_121c = *(float *)(ray + 4);
  fStack_1218 = *(float *)(ray + 8);
  fStack_1214 = *(float *)(ray + 0xc);
  fStack_1210 = *(float *)(ray + 0x10);
  fStack_120c = *(float *)(ray + 0x14);
  fStack_1208 = *(float *)(ray + 0x18);
  uStack_1204 = *(undefined4 *)(ray + 0x1c);
  auVar8._4_4_ = auVar28._4_4_ * -*(float *)(ray + 4);
  auVar8._0_4_ = auVar28._0_4_ * -*(float *)ray;
  auVar8._8_4_ = auVar28._8_4_ * -*(float *)(ray + 8);
  auVar8._12_4_ = auVar28._12_4_ * -*(float *)(ray + 0xc);
  auVar8._16_4_ = -*(float *)(ray + 0x10) * 0.0;
  auVar8._20_4_ = -*(float *)(ray + 0x14) * 0.0;
  auVar8._24_4_ = -*(float *)(ray + 0x18) * 0.0;
  auVar8._28_4_ = auVar22._28_4_;
  fStack_123c = *(float *)(ray + 0x24);
  fStack_1238 = *(float *)(ray + 0x28);
  fStack_1234 = *(float *)(ray + 0x2c);
  fStack_1230 = *(float *)(ray + 0x30);
  fStack_122c = *(float *)(ray + 0x34);
  fStack_1228 = *(float *)(ray + 0x38);
  uStack_1224 = *(undefined4 *)(ray + 0x3c);
  auVar107._0_4_ = auVar29._0_4_ * -local_1240;
  auVar107._4_4_ = auVar29._4_4_ * -*(float *)(ray + 0x24);
  auVar107._8_4_ = auVar29._8_4_ * -*(float *)(ray + 0x28);
  auVar107._12_4_ = auVar29._12_4_ * -*(float *)(ray + 0x2c);
  auVar107._16_4_ = -*(float *)(ray + 0x30) * 0.0;
  auVar107._20_4_ = -*(float *)(ray + 0x34) * 0.0;
  auVar107._28_36_ = in_ZMM15._28_36_;
  auVar107._24_4_ = -*(float *)(ray + 0x38) * 0.0;
  fStack_125c = *(float *)(ray + 0x44);
  fStack_1258 = *(float *)(ray + 0x48);
  fStack_1254 = *(float *)(ray + 0x4c);
  fStack_1250 = *(float *)(ray + 0x50);
  fStack_124c = *(float *)(ray + 0x54);
  fStack_1248 = *(float *)(ray + 0x58);
  uStack_1244 = *(undefined4 *)(ray + 0x5c);
  local_1180 = 0x80000000;
  uStack_117c = 0x80000000;
  uStack_1178 = 0x80000000;
  uStack_1174 = 0x80000000;
  uStack_1170 = 0x80000000;
  uStack_116c = 0x80000000;
  uStack_1168 = 0x80000000;
  uStack_1164 = 0x80000000;
  auVar22._4_4_ = auVar30._4_4_ * -*(float *)(ray + 0x44);
  auVar22._0_4_ = auVar30._0_4_ * -local_1260;
  auVar22._8_4_ = auVar30._8_4_ * -*(float *)(ray + 0x48);
  auVar22._12_4_ = auVar30._12_4_ * -*(float *)(ray + 0x4c);
  auVar22._16_4_ = -*(float *)(ray + 0x50) * 0.0;
  auVar22._20_4_ = -*(float *)(ray + 0x54) * 0.0;
  auVar22._24_4_ = -*(float *)(ray + 0x58) * 0.0;
  auVar22._28_4_ = local_1580._28_4_;
  local_12a0 = 0x7f800000;
  uStack_129c = 0x7f800000;
  uStack_1298 = 0x7f800000;
  uStack_1294 = 0x7f800000;
  uStack_1290 = 0x7f800000;
  uStack_128c = 0x7f800000;
  uStack_1288 = 0x7f800000;
  uStack_1284 = 0x7f800000;
  pRVar54 = ray;
LAB_015e0a76:
  lVar60 = 0;
  for (uVar59 = uVar51; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar60 = lVar60 + 1;
  }
  uVar53 = *(undefined4 *)(local_1300 + lVar60 * 4);
  auVar65._4_4_ = uVar53;
  auVar65._0_4_ = uVar53;
  auVar65._8_4_ = uVar53;
  auVar65._12_4_ = uVar53;
  auVar65._16_4_ = uVar53;
  auVar65._20_4_ = uVar53;
  auVar65._24_4_ = uVar53;
  auVar65._28_4_ = uVar53;
  local_1380 = vpcmpeqd_avx2(auVar65,local_1300);
  uVar53 = vmovmskps_avx(local_1380);
  local_f98 = CONCAT44((int)((ulong)pRVar54 >> 0x20),uVar53);
  auVar105._8_4_ = 0x7f800000;
  auVar105._0_8_ = 0x7f8000007f800000;
  auVar105._12_4_ = 0x7f800000;
  auVar105._16_4_ = 0x7f800000;
  auVar105._20_4_ = 0x7f800000;
  auVar105._24_4_ = 0x7f800000;
  auVar105._28_4_ = 0x7f800000;
  auVar10 = vblendvps_avx(auVar105,auVar46,local_1380);
  uVar51 = ~local_f98 & uVar51;
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar65 = vminps_avx(auVar10,auVar65);
  auVar10 = vblendvps_avx(auVar105,auVar47,local_1380);
  auVar15 = vminps_avx(auVar65._0_16_,auVar65._16_16_);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar16 = vminps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar16 = vunpcklps_avx(auVar15,auVar16);
  auVar10 = vblendvps_avx(auVar105,auVar96,local_1380);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar15 = vminps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar12 = vinsertps_avx(auVar16,auVar15,0x28);
  auVar104._8_4_ = 0xff800000;
  auVar104._0_8_ = 0xff800000ff800000;
  auVar104._12_4_ = 0xff800000;
  auVar104._16_4_ = 0xff800000;
  auVar104._20_4_ = 0xff800000;
  auVar104._24_4_ = 0xff800000;
  auVar104._28_4_ = 0xff800000;
  auVar10 = vblendvps_avx(auVar104,auVar46,local_1380);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar15 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar10 = vblendvps_avx(auVar104,auVar47,local_1380);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar16 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar16 = vunpcklps_avx(auVar15,auVar16);
  auVar10 = vblendvps_avx(auVar104,auVar96,local_1380);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar15 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar87 = ZEXT1632(auVar28);
  auVar10 = vblendvps_avx(auVar105,auVar87,local_1380);
  auVar13 = vinsertps_avx(auVar16,auVar15,0x28);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar65 = vminps_avx(auVar10,auVar65);
  auVar97 = ZEXT1632(auVar29);
  auVar10 = vblendvps_avx(auVar105,auVar97,local_1380);
  auVar15 = vminps_avx(auVar65._0_16_,auVar65._16_16_);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar16 = vminps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar16 = vunpcklps_avx(auVar15,auVar16);
  auVar98 = ZEXT1632(auVar30);
  auVar10 = vblendvps_avx(auVar105,auVar98,local_1380);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar15 = vminps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar72 = vinsertps_avx(auVar16,auVar15,0x28);
  auVar10 = vblendvps_avx(auVar104,auVar87,local_1380);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar15 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar10 = vblendvps_avx(auVar104,auVar97,local_1380);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar16 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar16 = vunpcklps_avx(auVar15,auVar16);
  auVar10 = vblendvps_avx(auVar104,auVar98,local_1380);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar10 = vmaxps_avx(auVar10,auVar65);
  auVar15 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar10 = vblendvps_avx(auVar105,auVar81,local_1380);
  auVar14 = vinsertps_avx(auVar16,auVar15,0x28);
  auVar65 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar10 = vminps_avx(auVar10,auVar65);
  auVar65 = vshufpd_avx(auVar10,auVar10,5);
  auVar74 = vminps_avx(auVar10,auVar65);
  auVar65 = vblendvps_avx(auVar104,local_1280,local_1380);
  auVar10 = vshufps_avx(auVar65,auVar65,0xb1);
  auVar10 = vmaxps_avx(auVar65,auVar10);
  auVar75 = vshufpd_avx(auVar10,auVar10,5);
  auVar11 = vcmpps_avx(auVar72,_DAT_01f45a50,5);
  auVar15 = vblendvps_avx(auVar14,auVar72,auVar11);
  auVar16 = vblendvps_avx(auVar12,auVar13,auVar11);
  auVar10 = vmaxps_avx(auVar10,auVar75);
  auVar12 = vblendvps_avx(auVar13,auVar12,auVar11);
  local_1520._4_4_ = auVar15._0_4_;
  auVar13 = vmovshdup_avx(auVar15);
  uVar57 = (ulong)(auVar13._0_4_ < 0.0) << 4 | 0x20;
  auVar13 = vshufpd_avx(auVar15,auVar15,1);
  uVar49 = (ulong)(auVar13._0_4_ < 0.0) << 4 | 0x40;
  auVar17 = vminps_avx(auVar74._0_16_,auVar74._16_16_);
  auVar13 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
  auVar11 = vblendvps_avx(auVar72,auVar14,auVar11);
  local_1540 = auVar16._0_4_;
  fStack_153c = auVar16._4_4_;
  fStack_1538 = auVar16._8_4_;
  fStack_1534 = auVar16._12_4_;
  auVar72._0_4_ = (float)local_1520._4_4_ * local_1540;
  auVar72._4_4_ = auVar15._4_4_ * fStack_153c;
  auVar72._8_4_ = auVar15._8_4_ * fStack_1538;
  auVar72._12_4_ = auVar15._12_4_ * fStack_1534;
  fVar18 = auVar11._0_4_;
  auVar82._0_4_ = auVar12._0_4_ * fVar18;
  auVar82._4_4_ = auVar12._4_4_ * auVar11._4_4_;
  auVar82._8_4_ = auVar12._8_4_ * auVar11._8_4_;
  auVar82._12_4_ = auVar12._12_4_ * auVar11._12_4_;
  uVar58 = (ulong)((float)local_1520._4_4_ < 0.0) * 0x10;
  pGVar52 = *(Geometry **)&pAVar9[1].bounds.bounds0.lower.field_0;
  local_fa0 = pGVar52;
  local_1520._0_4_ = local_1520._4_4_;
  fStack_1518 = (float)local_1520._4_4_;
  fStack_1514 = (float)local_1520._4_4_;
  uVar59 = CONCAT44(auVar72._0_4_,auVar72._0_4_);
  local_1530._0_8_ = uVar59 ^ 0x8000000080000000;
  local_1530._8_4_ = -auVar72._0_4_;
  fStack_1524 = -auVar72._0_4_;
  auVar16 = vshufps_avx(auVar15,auVar15,0x55);
  auVar12 = vshufps_avx(auVar72,auVar72,0x55);
  auVar99._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
  auVar99._8_4_ = auVar12._8_4_ ^ 0x80000000;
  auVar99._12_4_ = auVar12._12_4_ ^ 0x80000000;
  auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
  auVar12 = vshufps_avx(auVar72,auVar72,0xaa);
  auVar72 = vshufps_avx(auVar11,auVar11,0x55);
  auVar14 = vshufps_avx(auVar82,auVar82,0x55);
  auVar73._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
  auVar73._8_4_ = auVar14._8_4_ ^ 0x80000000;
  auVar73._12_4_ = auVar14._12_4_ ^ 0x80000000;
  auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar14 = vshufps_avx(auVar82,auVar82,0xaa);
  local_1560._0_4_ = auVar17._0_4_;
  local_1560._4_4_ = local_1560._0_4_;
  local_1560._8_4_ = local_1560._0_4_;
  local_1560._12_4_ = local_1560._0_4_;
  uVar53 = auVar13._0_4_;
  pRVar56 = local_f90;
  auVar10._8_4_ = 0x7f800000;
  auVar10._0_8_ = 0x7f8000007f800000;
  auVar10._12_4_ = 0x7f800000;
  auVar10._16_4_ = 0x7f800000;
  auVar10._20_4_ = 0x7f800000;
  auVar10._24_4_ = 0x7f800000;
  auVar10._28_4_ = 0x7f800000;
  auVar10 = vblendvps_avx(auVar10,auVar81,local_1380);
LAB_015e0ebf:
  uVar50 = vmovmskps_avx(local_1580);
  do {
    pRVar54 = (RayK<8> *)&local_fa0;
    if (pRVar56 == pRVar54) goto LAB_015e157b;
    pRVar54 = pRVar56 + -0x10;
    pRVar63 = pRVar56 + -8;
    pRVar56 = pRVar54;
    if ((*(ulong *)pRVar63 & ~CONCAT44((int)((ulong)pGVar52 >> 0x20),uVar50)) != 0) {
      uVar59 = 1;
      pRVar63 = *(RayK<8> **)pRVar54;
      do {
        if (((ulong)pRVar63 & 8) != 0) {
          if (uVar59 != 0) {
            local_14a0._0_8_ = local_1580._0_8_ ^ 0xffffffffffffffff;
            local_14a0._8_4_ = local_1580._8_4_ ^ 0xffffffff;
            local_14a0._12_4_ = local_1580._12_4_ ^ 0xffffffff;
            local_14a0._16_4_ = local_1580._16_4_ ^ 0xffffffff;
            local_14a0._20_4_ = local_1580._20_4_ ^ 0xffffffff;
            local_14a0._24_4_ = local_1580._24_4_ ^ 0xffffffff;
            local_14a0._28_4_ = local_1580._28_4_ ^ 0xffffffff;
            local_1040 = *(undefined8 *)ray;
            uStack_1038 = *(undefined8 *)(ray + 8);
            uStack_1030 = *(undefined8 *)(ray + 0x10);
            uStack_1028 = *(undefined8 *)(ray + 0x18);
            local_1060 = *(undefined8 *)(ray + 0x20);
            uStack_1058 = *(undefined8 *)(ray + 0x28);
            uStack_1050 = *(undefined8 *)(ray + 0x30);
            uStack_1048 = *(undefined8 *)(ray + 0x38);
            local_1080 = *(undefined8 *)(ray + 0x40);
            uStack_1078 = *(undefined8 *)(ray + 0x48);
            uStack_1070 = *(undefined8 *)(ray + 0x50);
            uStack_1068 = *(undefined8 *)(ray + 0x58);
            uVar36 = *(undefined8 *)(ray + 0x60);
            uVar37 = *(undefined8 *)(ray + 0x68);
            uVar38 = *(undefined8 *)(ray + 0x70);
            local_11e0 = uVar36;
            uStack_11d8 = uVar37;
            uStack_11d0 = uVar38;
            uStack_11c8 = *(undefined8 *)(ray + 0x78);
            pRVar55 = ray + 0xa0;
            auVar43 = *(undefined1 (*) [24])pRVar55;
            local_10a0 = *(undefined8 *)pRVar55;
            uStack_1098 = *(undefined8 *)(ray + 0xa8);
            uStack_1090 = *(undefined8 *)(ray + 0xb0);
            uStack_1088 = *(undefined8 *)(ray + 0xb8);
            pRVar1 = ray + 0xc0;
            auVar44 = *(undefined1 (*) [24])pRVar1;
            local_10c0 = *(undefined8 *)pRVar1;
            uStack_10b8 = *(undefined8 *)(ray + 200);
            uStack_10b0 = *(undefined8 *)(ray + 0xd0);
            uStack_10a8 = *(undefined8 *)(ray + 0xd8);
            pRVar2 = ray + 0x80;
            auVar45 = *(undefined1 (*) [24])pRVar2;
            local_10e0 = *(undefined8 *)pRVar2;
            uStack_10d8 = *(undefined8 *)(ray + 0x88);
            uStack_10d0 = *(undefined8 *)(ray + 0x90);
            uStack_10c8 = *(undefined8 *)(ray + 0x98);
            uVar39 = *(undefined8 *)(ray + 0x100);
            uVar40 = *(undefined8 *)(ray + 0x108);
            uVar41 = *(undefined8 *)(ray + 0x110);
            local_1200 = uVar39;
            uStack_11f8 = uVar40;
            uStack_11f0 = uVar41;
            uStack_11e8 = *(undefined8 *)(ray + 0x118);
            local_1100 = *(undefined8 *)(ray + 0x120);
            uStack_10f8 = *(undefined8 *)(ray + 0x128);
            uStack_10f0 = *(undefined8 *)(ray + 0x130);
            uStack_10e8 = *(undefined8 *)(ray + 0x138);
            lVar64 = ((ulong)pRVar63 & 0xfffffffffffffff0) + 0x90;
            lVar60 = 0;
            pGVar52 = (Geometry *)ray;
            goto LAB_015e1181;
          }
          break;
        }
        auVar13 = vfmadd132ps_fma(*(undefined1 (*) [16])(pRVar63 + uVar58 + 0x20),_local_1530,
                                  _local_1520);
        auVar17 = vfmadd132ps_fma(*(undefined1 (*) [16])(pRVar63 + uVar57 + 0x20),auVar99,auVar16);
        auVar13 = vpmaxsd_avx(auVar13,auVar17);
        auVar27._8_4_ = auVar12._8_4_ ^ 0x80000000;
        auVar27._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
        auVar27._12_4_ = auVar12._12_4_ ^ 0x80000000;
        auVar17 = vfmadd132ps_fma(*(undefined1 (*) [16])(pRVar63 + uVar49 + 0x20),auVar27,auVar15);
        auVar17 = vpmaxsd_avx(auVar17,local_1560);
        auVar13 = vpmaxsd_avx(auVar13,auVar17);
        uVar59 = CONCAT44(auVar82._0_4_,auVar82._0_4_);
        auVar17._8_4_ = -auVar82._0_4_;
        auVar17._0_8_ = uVar59 ^ 0x8000000080000000;
        auVar17._12_4_ = -auVar82._0_4_;
        auVar26._4_4_ = fVar18;
        auVar26._0_4_ = fVar18;
        auVar26._8_4_ = fVar18;
        auVar26._12_4_ = fVar18;
        auVar17 = vfmadd132ps_fma(*(undefined1 (*) [16])(pRVar63 + (uVar58 ^ 0x10) + 0x20),auVar17,
                                  auVar26);
        auVar24 = vfmadd132ps_fma(*(undefined1 (*) [16])(pRVar63 + (uVar57 ^ 0x10) + 0x20),auVar73,
                                  auVar72);
        auVar17 = vpminsd_avx(auVar17,auVar24);
        auVar24._8_4_ = auVar14._8_4_ ^ 0x80000000;
        auVar24._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
        auVar24._12_4_ = auVar14._12_4_ ^ 0x80000000;
        auVar24 = vfmadd132ps_fma(*(undefined1 (*) [16])(pRVar63 + (uVar49 ^ 0x10) + 0x20),auVar24,
                                  auVar11);
        auVar25._4_4_ = uVar53;
        auVar25._0_4_ = uVar53;
        auVar25._8_4_ = uVar53;
        auVar25._12_4_ = uVar53;
        auVar24 = vpminsd_avx(auVar24,auVar25);
        auVar17 = vpminsd_avx(auVar17,auVar24);
        auVar13 = vcmpps_avx(auVar13,auVar17,2);
        uVar48 = vmovmskps_avx(auVar13);
        if (uVar48 == 0) break;
        uVar61 = (ulong)(uVar48 & 0xff);
        uVar59 = 0;
        pRVar55 = (RayK<8> *)0x8;
        do {
          pRVar54 = (RayK<8> *)0x0;
          for (uVar23 = uVar61; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
            pRVar54 = pRVar54 + 1;
          }
          uVar92 = *(undefined4 *)(pRVar63 + (long)pRVar54 * 4 + 0x20);
          auVar66._4_4_ = uVar92;
          auVar66._0_4_ = uVar92;
          auVar66._8_4_ = uVar92;
          auVar66._12_4_ = uVar92;
          auVar66._16_4_ = uVar92;
          auVar66._20_4_ = uVar92;
          auVar66._24_4_ = uVar92;
          auVar66._28_4_ = uVar92;
          uVar92 = *(undefined4 *)(pRVar63 + (long)pRVar54 * 4 + 0x40);
          auVar76._4_4_ = uVar92;
          auVar76._0_4_ = uVar92;
          auVar76._8_4_ = uVar92;
          auVar76._12_4_ = uVar92;
          auVar76._16_4_ = uVar92;
          auVar76._20_4_ = uVar92;
          auVar76._24_4_ = uVar92;
          auVar76._28_4_ = uVar92;
          auVar13 = vfmadd213ps_fma(auVar66,auVar87,auVar8);
          auVar17 = vfmadd213ps_fma(auVar76,auVar97,auVar107._0_32_);
          uVar92 = *(undefined4 *)(pRVar63 + (long)pRVar54 * 4 + 0x60);
          auVar83._4_4_ = uVar92;
          auVar83._0_4_ = uVar92;
          auVar83._8_4_ = uVar92;
          auVar83._12_4_ = uVar92;
          auVar83._16_4_ = uVar92;
          auVar83._20_4_ = uVar92;
          auVar83._24_4_ = uVar92;
          auVar83._28_4_ = uVar92;
          auVar24 = vfmadd213ps_fma(auVar83,auVar98,auVar22);
          uVar92 = *(undefined4 *)(pRVar63 + (long)pRVar54 * 4 + 0x30);
          auVar88._4_4_ = uVar92;
          auVar88._0_4_ = uVar92;
          auVar88._8_4_ = uVar92;
          auVar88._12_4_ = uVar92;
          auVar88._16_4_ = uVar92;
          auVar88._20_4_ = uVar92;
          auVar88._24_4_ = uVar92;
          auVar88._28_4_ = uVar92;
          auVar25 = vfmadd213ps_fma(auVar88,auVar87,auVar8);
          uVar92 = *(undefined4 *)(pRVar63 + (long)pRVar54 * 4 + 0x50);
          auVar100._4_4_ = uVar92;
          auVar100._0_4_ = uVar92;
          auVar100._8_4_ = uVar92;
          auVar100._12_4_ = uVar92;
          auVar100._16_4_ = uVar92;
          auVar100._20_4_ = uVar92;
          auVar100._24_4_ = uVar92;
          auVar100._28_4_ = uVar92;
          uVar92 = *(undefined4 *)(pRVar63 + (long)pRVar54 * 4 + 0x70);
          auVar102._4_4_ = uVar92;
          auVar102._0_4_ = uVar92;
          auVar102._8_4_ = uVar92;
          auVar102._12_4_ = uVar92;
          auVar102._16_4_ = uVar92;
          auVar102._20_4_ = uVar92;
          auVar102._24_4_ = uVar92;
          auVar102._28_4_ = uVar92;
          auVar26 = vfmadd213ps_fma(auVar100,auVar97,auVar107._0_32_);
          auVar27 = vfmadd213ps_fma(auVar102,auVar98,auVar22);
          auVar74 = vpminsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar25));
          auVar75 = vpminsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar26));
          auVar74 = vpmaxsd_avx2(auVar74,auVar75);
          auVar75 = vpminsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar27));
          auVar75 = vpmaxsd_avx2(auVar75,auVar10);
          auVar74 = vpmaxsd_avx2(auVar74,auVar75);
          auVar75 = vpmaxsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar25));
          auVar104 = vpmaxsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar26));
          auVar104 = vpminsd_avx2(auVar75,auVar104);
          auVar75 = vpmaxsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar27));
          auVar75 = vpminsd_avx2(auVar75,auVar65);
          auVar75 = vpminsd_avx2(auVar104,auVar75);
          auVar74 = vcmpps_avx(auVar74,auVar75,2);
          if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar74 >> 0x7f,0) != '\0') ||
                (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar74 >> 0xbf,0) != '\0') ||
              (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar74[0x1f] < '\0') {
            pRVar54 = *(RayK<8> **)(pRVar63 + (long)pRVar54 * 8);
            if (pRVar55 != (RayK<8> *)0x8) {
              *(RayK<8> **)pRVar56 = pRVar55;
              *(ulong *)(pRVar56 + 8) = uVar59;
              pRVar56 = pRVar56 + 0x10;
            }
            uVar48 = vmovmskps_avx(auVar74);
            uVar59 = (ulong)uVar48;
            pRVar55 = pRVar54;
          }
          uVar61 = uVar61 - 1 & uVar61;
        } while (uVar61 != 0);
        pRVar63 = pRVar55;
      } while (pRVar55 != (RayK<8> *)0x8);
    }
  } while( true );
LAB_015e1181:
  do {
    if (lVar60 == (ulong)((uint)pRVar63 & 0xf) - 8) break;
    lVar62 = -0x10;
    local_14e0 = local_14a0;
    do {
      if (lVar62 == 0) break;
      pRVar54 = (RayK<8> *)(ulong)*(uint *)(lVar64 + 0x10 + lVar62);
      pGVar52 = (Geometry *)0x0;
      if (pRVar54 == (RayK<8> *)0xffffffff) break;
      uVar50 = *(undefined4 *)(lVar64 + -0x80 + lVar62);
      auVar67._4_4_ = uVar50;
      auVar67._0_4_ = uVar50;
      auVar67._8_4_ = uVar50;
      auVar67._12_4_ = uVar50;
      auVar67._16_4_ = uVar50;
      auVar67._20_4_ = uVar50;
      auVar67._24_4_ = uVar50;
      auVar67._28_4_ = uVar50;
      auVar75 = vsubps_avx(auVar67,*(undefined1 (*) [32])ray);
      uVar50 = *(undefined4 *)(lVar64 + -0x70 + lVar62);
      auVar68._4_4_ = uVar50;
      auVar68._0_4_ = uVar50;
      auVar68._8_4_ = uVar50;
      auVar68._12_4_ = uVar50;
      auVar68._16_4_ = uVar50;
      auVar68._20_4_ = uVar50;
      auVar68._24_4_ = uVar50;
      auVar68._28_4_ = uVar50;
      uVar50 = *(undefined4 *)(lVar64 + -0x60 + lVar62);
      auVar77._4_4_ = uVar50;
      auVar77._0_4_ = uVar50;
      auVar77._8_4_ = uVar50;
      auVar77._12_4_ = uVar50;
      auVar77._16_4_ = uVar50;
      auVar77._20_4_ = uVar50;
      auVar77._24_4_ = uVar50;
      auVar77._28_4_ = uVar50;
      auVar104 = vsubps_avx(auVar68,*(undefined1 (*) [32])(ray + 0x20));
      auVar74 = vsubps_avx(auVar77,*(undefined1 (*) [32])(ray + 0x40));
      fVar93 = *(float *)(lVar64 + -0x50 + lVar62);
      local_1120._4_4_ = fVar93;
      local_1120._0_4_ = fVar93;
      local_1120._8_4_ = fVar93;
      local_1120._12_4_ = fVar93;
      local_1120._16_4_ = fVar93;
      local_1120._20_4_ = fVar93;
      local_1120._24_4_ = fVar93;
      local_1120._28_4_ = fVar93;
      fVar3 = *(float *)(lVar64 + -0x40 + lVar62);
      local_1140._4_4_ = fVar3;
      local_1140._0_4_ = fVar3;
      local_1140._8_4_ = fVar3;
      local_1140._12_4_ = fVar3;
      local_1140._16_4_ = fVar3;
      local_1140._20_4_ = fVar3;
      local_1140._24_4_ = fVar3;
      local_1140._28_4_ = fVar3;
      fVar4 = *(float *)(lVar64 + -0x30 + lVar62);
      local_1160._4_4_ = fVar4;
      local_1160._0_4_ = fVar4;
      local_1160._8_4_ = fVar4;
      local_1160._12_4_ = fVar4;
      local_1160._16_4_ = fVar4;
      local_1160._20_4_ = fVar4;
      local_1160._24_4_ = fVar4;
      local_1160._28_4_ = fVar4;
      fVar5 = *(float *)(lVar64 + -0x20 + lVar62);
      local_fe0._4_4_ = fVar5;
      local_fe0._0_4_ = fVar5;
      local_fe0._8_4_ = fVar5;
      local_fe0._12_4_ = fVar5;
      local_fe0._16_4_ = fVar5;
      local_fe0._20_4_ = fVar5;
      local_fe0._24_4_ = fVar5;
      local_fe0._28_4_ = fVar5;
      fVar6 = *(float *)(lVar64 + -0x10 + lVar62);
      local_1000._4_4_ = fVar6;
      local_1000._0_4_ = fVar6;
      local_1000._8_4_ = fVar6;
      local_1000._12_4_ = fVar6;
      local_1000._16_4_ = fVar6;
      local_1000._20_4_ = fVar6;
      local_1000._24_4_ = fVar6;
      local_1000._28_4_ = fVar6;
      fVar7 = *(float *)(lVar64 + lVar62);
      local_fc0._4_4_ = fVar7;
      local_fc0._0_4_ = fVar7;
      local_fc0._8_4_ = fVar7;
      local_fc0._12_4_ = fVar7;
      local_fc0._16_4_ = fVar7;
      local_fc0._20_4_ = fVar7;
      local_fc0._24_4_ = fVar7;
      local_fc0._28_4_ = fVar7;
      fVar19 = fVar3 * fVar7;
      auVar84._4_4_ = fVar19;
      auVar84._0_4_ = fVar19;
      auVar84._8_4_ = fVar19;
      auVar84._12_4_ = fVar19;
      auVar84._16_4_ = fVar19;
      auVar84._20_4_ = fVar19;
      auVar84._24_4_ = fVar19;
      auVar84._28_4_ = fVar19;
      auVar24 = vfmsub231ps_fma(auVar84,local_1000,local_1160);
      fVar19 = fVar5 * fVar4;
      auVar103._4_4_ = fVar19;
      auVar103._0_4_ = fVar19;
      auVar103._8_4_ = fVar19;
      auVar103._12_4_ = fVar19;
      auVar103._16_4_ = fVar19;
      auVar103._20_4_ = fVar19;
      auVar103._24_4_ = fVar19;
      auVar103._28_4_ = fVar19;
      auVar13 = vfmsub231ps_fma(auVar103,local_fc0,local_1120);
      fVar93 = fVar93 * fVar6;
      auVar85._4_4_ = fVar93;
      auVar85._0_4_ = fVar93;
      auVar85._8_4_ = fVar93;
      auVar85._12_4_ = fVar93;
      auVar85._16_4_ = fVar93;
      auVar85._20_4_ = fVar93;
      auVar85._24_4_ = fVar93;
      auVar85._28_4_ = fVar93;
      auVar25 = vfmsub231ps_fma(auVar85,local_fe0,local_1140);
      local_1480 = auVar74._0_4_;
      fStack_147c = auVar74._4_4_;
      fStack_1478 = auVar74._8_4_;
      fStack_1474 = auVar74._12_4_;
      fStack_1470 = auVar74._16_4_;
      fStack_146c = auVar74._20_4_;
      fStack_1468 = auVar74._24_4_;
      auVar20._4_4_ = auVar43._4_4_ * fStack_147c;
      auVar20._0_4_ = auVar43._0_4_ * local_1480;
      auVar20._8_4_ = auVar43._8_4_ * fStack_1478;
      auVar20._12_4_ = auVar43._12_4_ * fStack_1474;
      auVar20._16_4_ = auVar43._16_4_ * fStack_1470;
      auVar20._20_4_ = auVar43._20_4_ * fStack_146c;
      auVar20._24_4_ = (float)*(undefined8 *)(ray + 0xb8) * fStack_1468;
      auVar20._28_4_ = fVar5;
      auVar17 = vfmsub231ps_fma(auVar20,auVar104,*(undefined1 (*) [32])pRVar1);
      local_1020 = ZEXT1632(auVar17);
      auVar21._4_4_ = auVar44._4_4_ * auVar75._4_4_;
      auVar21._0_4_ = auVar44._0_4_ * auVar75._0_4_;
      auVar21._8_4_ = auVar44._8_4_ * auVar75._8_4_;
      auVar21._12_4_ = auVar44._12_4_ * auVar75._12_4_;
      auVar21._16_4_ = auVar44._16_4_ * auVar75._16_4_;
      auVar21._20_4_ = auVar44._20_4_ * auVar75._20_4_;
      fVar93 = (float)*(undefined8 *)(ray + 0xd8);
      auVar21._24_4_ = fVar93 * auVar75._24_4_;
      auVar21._28_4_ = fVar3;
      auVar26 = vfmsub231ps_fma(auVar21,*(undefined1 (*) [32])pRVar2,auVar74);
      auVar31._4_4_ = auVar45._4_4_ * auVar104._4_4_;
      auVar31._0_4_ = auVar45._0_4_ * auVar104._0_4_;
      auVar31._8_4_ = auVar45._8_4_ * auVar104._8_4_;
      auVar31._12_4_ = auVar45._12_4_ * auVar104._12_4_;
      auVar31._16_4_ = auVar45._16_4_ * auVar104._16_4_;
      auVar31._20_4_ = auVar45._20_4_ * auVar104._20_4_;
      auVar31._24_4_ = (float)*(undefined8 *)(ray + 0x98) * auVar104._24_4_;
      auVar31._28_4_ = auVar104._28_4_;
      auVar27 = vfmsub231ps_fma(auVar31,auVar75,*(undefined1 (*) [32])pRVar55);
      local_11c0 = ZEXT1632(auVar25);
      auVar86._0_4_ = auVar25._0_4_ * auVar44._0_4_;
      auVar86._4_4_ = auVar25._4_4_ * auVar44._4_4_;
      auVar86._8_4_ = auVar25._8_4_ * auVar44._8_4_;
      auVar86._12_4_ = auVar25._12_4_ * auVar44._12_4_;
      auVar86._16_4_ = auVar44._16_4_ * 0.0;
      auVar86._20_4_ = auVar44._20_4_ * 0.0;
      auVar86._24_4_ = fVar93 * 0.0;
      auVar86._28_4_ = 0;
      local_11a0 = ZEXT1632(auVar13);
      auVar13 = vfmadd231ps_fma(auVar86,local_11a0,*(undefined1 (*) [32])pRVar55);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),*(undefined1 (*) [32])pRVar2,ZEXT1632(auVar24));
      auVar32._4_4_ = auVar27._4_4_ * fVar7;
      auVar32._0_4_ = auVar27._0_4_ * fVar7;
      auVar32._8_4_ = auVar27._8_4_ * fVar7;
      auVar32._12_4_ = auVar27._12_4_ * fVar7;
      auVar32._16_4_ = fVar7 * 0.0;
      auVar32._20_4_ = fVar7 * 0.0;
      auVar32._24_4_ = fVar7 * 0.0;
      auVar32._28_4_ = auVar75._28_4_;
      auVar17 = vfmadd231ps_fma(auVar32,ZEXT1632(auVar26),local_1000);
      auVar42._8_4_ = 0x80000000;
      auVar42._0_8_ = 0x8000000080000000;
      auVar42._12_4_ = 0x80000000;
      auVar42._16_4_ = 0x80000000;
      auVar42._20_4_ = 0x80000000;
      auVar42._24_4_ = 0x80000000;
      auVar42._28_4_ = 0x80000000;
      auVar74 = vandps_avx(ZEXT1632(auVar13),auVar42);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_1020,local_fe0);
      uVar48 = auVar74._0_4_;
      auVar106._0_4_ = uVar48 ^ auVar17._0_4_;
      uVar89 = auVar74._4_4_;
      auVar106._4_4_ = uVar89 ^ auVar17._4_4_;
      uVar90 = auVar74._8_4_;
      auVar106._8_4_ = uVar90 ^ auVar17._8_4_;
      uVar91 = auVar74._12_4_;
      auVar106._12_4_ = uVar91 ^ auVar17._12_4_;
      uVar50 = auVar74._16_4_;
      auVar106._16_4_ = uVar50;
      uVar92 = auVar74._20_4_;
      auVar106._20_4_ = uVar92;
      uVar94 = auVar74._24_4_;
      auVar106._24_4_ = uVar94;
      uVar95 = auVar74._28_4_;
      auVar106._28_4_ = uVar95;
      auVar74 = vcmpps_avx(auVar106,_DAT_01f7b000,5);
      auVar105 = local_14e0 & auVar74;
      auVar78._8_8_ = mm_lookupmask_ps._24_8_;
      auVar78._0_8_ = mm_lookupmask_ps._16_8_;
      auVar78._16_8_ = mm_lookupmask_ps._16_8_;
      auVar78._24_8_ = mm_lookupmask_ps._24_8_;
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0x7f,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar105 >> 0xbf,0) != '\0') ||
          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar105[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar74,local_14e0);
        auVar33._4_4_ = auVar27._4_4_ * fVar4;
        auVar33._0_4_ = auVar27._0_4_ * fVar4;
        auVar33._8_4_ = auVar27._8_4_ * fVar4;
        auVar33._12_4_ = auVar27._12_4_ * fVar4;
        auVar33._16_4_ = fVar4 * 0.0;
        auVar33._20_4_ = fVar4 * 0.0;
        auVar33._24_4_ = fVar4 * 0.0;
        auVar33._28_4_ = auVar74._28_4_;
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar26),auVar33,local_1140);
        auVar17 = vfmadd132ps_fma(local_1020,ZEXT1632(auVar17),local_1120);
        auVar101._0_4_ = auVar17._0_4_ ^ uVar48;
        auVar101._4_4_ = auVar17._4_4_ ^ uVar89;
        auVar101._8_4_ = auVar17._8_4_ ^ uVar90;
        auVar101._12_4_ = auVar17._12_4_ ^ uVar91;
        auVar101._16_4_ = uVar50;
        auVar101._20_4_ = uVar92;
        auVar101._24_4_ = uVar94;
        auVar101._28_4_ = uVar95;
        auVar74 = vcmpps_avx(auVar101,_DAT_01f7b000,5);
        auVar20 = auVar105 & auVar74;
        if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0x7f,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0xbf,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar20[0x1f] < '\0') {
          auVar20 = vandps_avx(ZEXT1632(auVar13),local_12e0);
          auVar74 = vandps_avx(auVar105,auVar74);
          auVar105 = vsubps_avx(auVar20,auVar106);
          auVar105 = vcmpps_avx(auVar105,auVar101,5);
          auVar21 = auVar74 & auVar105;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0x7f,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0xbf,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar21[0x1f] < '\0') {
            auVar74 = vandps_avx(auVar105,auVar74);
            auVar34._4_4_ = auVar25._4_4_ * fStack_147c;
            auVar34._0_4_ = auVar25._0_4_ * local_1480;
            auVar34._8_4_ = auVar25._8_4_ * fStack_1478;
            auVar34._12_4_ = auVar25._12_4_ * fStack_1474;
            auVar34._16_4_ = fStack_1470 * 0.0;
            auVar34._20_4_ = fStack_146c * 0.0;
            auVar34._24_4_ = fStack_1468 * 0.0;
            auVar34._28_4_ = 0;
            auVar17 = vfmadd132ps_fma(auVar104,auVar34,local_11a0);
            auVar17 = vfmadd132ps_fma(auVar75,ZEXT1632(auVar17),ZEXT1632(auVar24));
            auVar70._0_4_ = uVar48 ^ auVar17._0_4_;
            auVar70._4_4_ = uVar89 ^ auVar17._4_4_;
            auVar70._8_4_ = uVar90 ^ auVar17._8_4_;
            auVar70._12_4_ = uVar91 ^ auVar17._12_4_;
            auVar70._16_4_ = uVar50;
            auVar70._20_4_ = uVar92;
            auVar70._24_4_ = uVar94;
            auVar70._28_4_ = uVar95;
            local_11e0._0_4_ = (float)uVar36;
            local_11e0._4_4_ = (float)((ulong)uVar36 >> 0x20);
            uStack_11d8._0_4_ = (float)uVar37;
            uStack_11d8._4_4_ = (float)((ulong)uVar37 >> 0x20);
            uStack_11d0._0_4_ = (float)uVar38;
            uStack_11d0._4_4_ = (float)((ulong)uVar38 >> 0x20);
            uStack_11c8._0_4_ = (float)*(undefined8 *)(ray + 0x78);
            auVar79._0_4_ = auVar20._0_4_ * (float)local_11e0;
            auVar79._4_4_ = auVar20._4_4_ * local_11e0._4_4_;
            auVar79._8_4_ = auVar20._8_4_ * (float)uStack_11d8;
            auVar79._12_4_ = auVar20._12_4_ * uStack_11d8._4_4_;
            auVar79._16_4_ = auVar20._16_4_ * (float)uStack_11d0;
            auVar79._20_4_ = auVar20._20_4_ * uStack_11d0._4_4_;
            auVar79._24_4_ = auVar20._24_4_ * (float)uStack_11c8;
            auVar79._28_4_ = 0;
            auVar75 = vcmpps_avx(auVar79,auVar70,1);
            local_1200._0_4_ = (float)uVar39;
            local_1200._4_4_ = (float)((ulong)uVar39 >> 0x20);
            uStack_11f8._0_4_ = (float)uVar40;
            uStack_11f8._4_4_ = (float)((ulong)uVar40 >> 0x20);
            uStack_11f0._0_4_ = (float)uVar41;
            uStack_11f0._4_4_ = (float)((ulong)uVar41 >> 0x20);
            uStack_11e8._0_4_ = (float)*(undefined8 *)(ray + 0x118);
            auVar35._4_4_ = auVar20._4_4_ * local_1200._4_4_;
            auVar35._0_4_ = auVar20._0_4_ * (float)local_1200;
            auVar35._8_4_ = auVar20._8_4_ * (float)uStack_11f8;
            auVar35._12_4_ = auVar20._12_4_ * uStack_11f8._4_4_;
            auVar35._16_4_ = auVar20._16_4_ * (float)uStack_11f0;
            auVar35._20_4_ = auVar20._20_4_ * uStack_11f0._4_4_;
            auVar35._24_4_ = auVar20._24_4_ * (float)uStack_11e8;
            auVar35._28_4_ = uVar95;
            auVar104 = vcmpps_avx(auVar70,auVar35,2);
            auVar75 = vandps_avx(auVar104,auVar75);
            auVar104 = auVar74 & auVar75;
            if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar104 >> 0x7f,0) != '\0') ||
                  (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar104 >> 0xbf,0) != '\0') ||
                (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar104[0x1f] < '\0') {
              auVar74 = vandps_avx(auVar74,auVar75);
              auVar75 = vcmpps_avx(ZEXT1632(auVar13),_DAT_01f7b000,4);
              auVar104 = auVar74 & auVar75;
              if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar104 >> 0x7f,0) == '\0') &&
                    (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar104 >> 0xbf,0) == '\0') &&
                  (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar104[0x1f]) {
              }
              else {
                auVar78 = vandps_avx(auVar75,auVar74);
              }
            }
          }
        }
      }
      pGVar52 = (context->scene->geometries).items[(long)pRVar54].ptr;
      uVar48 = pGVar52->mask;
      auVar69._4_4_ = uVar48;
      auVar69._0_4_ = uVar48;
      auVar69._8_4_ = uVar48;
      auVar69._12_4_ = uVar48;
      auVar69._16_4_ = uVar48;
      auVar69._20_4_ = uVar48;
      auVar69._24_4_ = uVar48;
      auVar69._28_4_ = uVar48;
      auVar74 = vpand_avx2(auVar69,*(undefined1 (*) [32])(ray + 0x120));
      auVar75 = vpcmpeqd_avx2(auVar74,_DAT_01f7b000);
      auVar74 = auVar78 & ~auVar75;
      if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar74 >> 0x7f,0) != '\0') ||
            (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar74 >> 0xbf,0) != '\0') ||
          (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar74[0x1f] < '\0') {
        auVar74 = vandnps_avx(auVar75,auVar78);
        local_14e0 = vandnps_avx(auVar74,local_14e0);
      }
      lVar62 = lVar62 + 4;
    } while ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (local_14e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_14e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(local_14e0 >> 0x7f,0) != '\0') ||
               (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(local_14e0 >> 0xbf,0) != '\0') ||
             (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             local_14e0[0x1f] < '\0');
    auVar74 = vandps_avx(local_14e0,local_14a0);
    lVar60 = lVar60 + 1;
    lVar64 = lVar64 + 0xb0;
    local_14e0 = local_14a0 & local_14e0;
    local_14a0 = auVar74;
  } while ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (local_14e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_14e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(local_14e0 >> 0x7f,0) != '\0') ||
             (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(local_14e0 >> 0xbf,0) != '\0') ||
           (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           local_14e0[0x1f] < '\0');
  auVar71._0_8_ = local_14a0._0_8_ ^ 0xffffffffffffffff;
  auVar71._8_4_ = local_14a0._8_4_ ^ 0xffffffff;
  auVar71._12_4_ = local_14a0._12_4_ ^ 0xffffffff;
  auVar71._16_4_ = local_14a0._16_4_ ^ 0xffffffff;
  auVar71._20_4_ = local_14a0._20_4_ ^ 0xffffffff;
  auVar71._24_4_ = local_14a0._24_4_ ^ 0xffffffff;
  auVar71._28_4_ = local_14a0._28_4_ ^ 0xffffffff;
  local_1580 = vorps_avx(local_1580,auVar71);
  auVar74 = local_1380 & ~local_1580;
  if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar74 >> 0x7f,0) == '\0') &&
        (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar74 >> 0xbf,0) == '\0') &&
      (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar74[0x1f])
  goto LAB_015e157b;
  local_1380 = vandnps_avx(local_1580,local_1380);
  auVar80._8_4_ = 0xff800000;
  auVar80._0_8_ = 0xff800000ff800000;
  auVar80._12_4_ = 0xff800000;
  auVar80._16_4_ = 0xff800000;
  auVar80._20_4_ = 0xff800000;
  auVar80._24_4_ = 0xff800000;
  auVar80._28_4_ = 0xff800000;
  auVar65 = vblendvps_avx(auVar65,auVar80,local_1580);
  goto LAB_015e0ebf;
LAB_015e157b:
  if (uVar51 == 0) {
    auVar22 = vpcmpeqd_avx2(local_1580,local_1580);
    auVar22 = vpcmpeqd_avx2(auVar22,(undefined1  [32])local_12c0);
    auVar22 = vpand_avx2(auVar22,local_1580);
    auVar81._8_4_ = 0xff800000;
    auVar81._0_8_ = 0xff800000ff800000;
    auVar81._12_4_ = 0xff800000;
    auVar81._16_4_ = 0xff800000;
    auVar81._20_4_ = 0xff800000;
    auVar81._24_4_ = 0xff800000;
    auVar81._28_4_ = 0xff800000;
    auVar22 = vmaskmovps_avx(auVar22,auVar81);
    *(undefined1 (*) [32])(ray + 0x100) = auVar22;
    return;
  }
  goto LAB_015e0a76;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }